

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
HasProperty_Internal<false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,bool *noRedecl,PropertyValueInfo *info,
          bool *pDeclaredProperty,bool *pNonconfigurableProperty)

{
  byte bVar1;
  PropertyIndex PVar2;
  bool bVar3;
  uint32 index;
  BOOL BVar4;
  int local_44;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSStack_40;
  int i;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyRecord *propertyRecord;
  
  if (propertyId != -1) {
    descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                 ScriptContext::GetPropertyName
                           ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr
                             )->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
    bVar3 = JsUtil::
            BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                        *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,
                       &stack0xffffffffffffffc0,&local_44);
    if (bVar3) {
      bVar1 = pSStack_40->Attributes;
      BVar4 = 0;
      if ((bVar1 & 0x18) == 0) {
        if (0x3f < bVar1 && noRedecl != (bool *)0x0) {
          *noRedecl = true;
        }
        if (0x1f < bVar1 && pDeclaredProperty != (bool *)0x0) {
          *pDeclaredProperty = true;
        }
        if ((pNonconfigurableProperty != (bool *)0x0) && ((bVar1 & 2) == 0)) {
          *pNonconfigurableProperty = true;
        }
        BVar4 = 1;
        if ((info != (PropertyValueInfo *)0x0) &&
           (PVar2 = pSStack_40->propertyIndex, PVar2 != 0xffff)) {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = PVar2;
          info->m_attributes = bVar1;
          info->flags = InlineCacheNoFlags;
          if (((uint)*pSStack_40 & 6) != 2) {
            *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
          }
        }
      }
    }
    else {
      bVar3 = DynamicObject::HasObjectArray(instance);
      BVar4 = 0;
      if ((bVar3) && (*(char *)(descriptor + 4) == '\x01')) {
        index = PropertyRecord::GetNumericValue((PropertyRecord *)descriptor);
        BVar4 = DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,instance,index);
      }
    }
    return BVar4;
  }
  return 0;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasProperty_Internal(DynamicObject* instance, PropertyId propertyId, bool *noRedecl, _Inout_opt_ PropertyValueInfo* info, bool *pDeclaredProperty, bool *pNonconfigurableProperty)
    {
        // HasProperty is called with NoProperty in JavascriptDispatch.cpp to for undeferral of the
        // deferred type system that DOM objects use.  Allow NoProperty for this reason, but only
        // here in HasProperty.
        if (propertyId == Constants::NoProperty)
        {
            return false;
        }

        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((descriptor->Attributes & PropertyDeleted) || (!allowLetConstGlobal && !descriptor->HasNonLetConstGlobal()))
            {
                return false;
            }
            if (noRedecl && descriptor->Attributes & PropertyNoRedecl)
            {
                *noRedecl = true;
            }
            if (pDeclaredProperty && descriptor->Attributes & (PropertyNoRedecl | PropertyDeclaredGlobal))
            {
                *pDeclaredProperty = true;
            }
            if (pNonconfigurableProperty && !(descriptor->Attributes & PropertyConfigurable))
            {
                *pNonconfigurableProperty = true;
            }
            if (info && descriptor->propertyIndex != NoSlots)
            {
                SetPropertyValueInfo(info, instance, descriptor);
            }
            return true;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasItem(instance, propertyRecord->GetNumericValue());
        }

        return false;
    }